

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

curl_hash *
Curl_hash_alloc(int slots,hash_function hfunc,comp_function comparator,curl_hash_dtor dtor)

{
  int iVar1;
  curl_hash *h;
  
  if (((dtor != (curl_hash_dtor)0x0 && comparator != (comp_function)0x0) &&
       (hfunc != (hash_function)0x0 && slots != 0)) &&
     (h = (curl_hash *)(*Curl_cmalloc)(0x30), h != (curl_hash *)0x0)) {
    iVar1 = Curl_hash_init(h,slots,hfunc,comparator,dtor);
    if (iVar1 == 0) {
      return h;
    }
    (*Curl_cfree)(h);
  }
  return (curl_hash *)0x0;
}

Assistant:

struct curl_hash *
Curl_hash_alloc(int slots,
                hash_function hfunc,
                comp_function comparator,
                curl_hash_dtor dtor)
{
  struct curl_hash *h;

  if(!slots || !hfunc || !comparator ||!dtor) {
    return NULL; /* failure */
  }

  h = malloc(sizeof(struct curl_hash));
  if(h) {
    if(Curl_hash_init(h, slots, hfunc, comparator, dtor)) {
      /* failure */
      free(h);
      h = NULL;
    }
  }

  return h;
}